

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhPageSplit(lhpage *pOld,lhpage *pNew,pgno split_bucket,pgno high_mask)

{
  sxu32 nSize;
  lhcell *plVar1;
  int iVar2;
  int iVar3;
  lhcell *pCell;
  lhpage *pPage;
  uint in_R8D;
  sxu16 nOfft;
  undefined1 local_62 [2];
  SyMemBackend *local_60;
  void *local_58;
  undefined8 uStack_50;
  uint local_48;
  lhpage *local_40;
  ulong local_38;
  
  local_60 = (SyMemBackend *)&pOld->pRaw;
  local_58 = (void *)0x0;
  uStack_50 = 0;
  local_48 = 0;
  local_38 = high_mask;
  if (pNew == (lhpage *)0x0) {
    iVar2 = 0;
  }
  else {
    do {
      plVar1 = ((lhcell *)pNew)->pNext;
      if ((((lhcell *)pNew)->nHash & in_R8D) != high_mask) {
        if (((lhcell *)pNew)->iOvfl == 0) {
          uStack_50 = uStack_50 & 0xffffffff00000000;
          if ((local_48 & 4) != 0) {
            local_58 = (void *)0x0;
            uStack_50 = 0;
            local_48 = local_48 & 0xfffffffb;
          }
          if ((((((lhcell *)pNew)->sKey).nByte == 0) &&
              (iVar2 = lhConsumeCellkey((lhcell *)pNew,unqliteDataConsumer,&((lhcell *)pNew)->sKey,0
                                       ), iVar2 != 0)) ||
             (iVar2 = lhConsumeCellData((lhcell *)pNew,unqliteDataConsumer,&local_60), iVar2 != 0))
          goto LAB_0011500e;
          iVar2 = lhStoreCell((lhpage *)split_bucket,(((lhcell *)pNew)->sKey).pBlob,
                              (((lhcell *)pNew)->sKey).nByte,local_58,uStack_50 & 0xffffffff,
                              ((lhcell *)pNew)->nHash,1);
        }
        else {
          local_40 = (lhpage *)split_bucket;
          iVar2 = lhAllocateSpace((lhpage *)split_bucket,0x1a,(sxu16 *)local_62);
          pPage = (lhpage *)split_bucket;
          if ((iVar2 == 0) ||
             (iVar2 = lhFindSlavePage(*(lhpage **)split_bucket,*(sxu64 *)(split_bucket + 0x40),
                                      (sxu16 *)0x1a,(lhpage **)local_62), pPage = local_40,
             high_mask = local_38, iVar2 == 0)) {
            pCell = lhNewCell(pPage->pHash,pPage);
            iVar2 = -1;
            high_mask = local_38;
            if (pCell != (lhcell *)0x0) {
              pCell->iStart = (sxu16)local_62;
              pCell->nData = ((lhcell *)pNew)->nData;
              pCell->nKey = ((lhcell *)pNew)->nKey;
              pCell->iOvfl = ((lhcell *)pNew)->iOvfl;
              pCell->iDataOfft = ((lhcell *)pNew)->iDataOfft;
              pCell->iDataPage = ((lhcell *)pNew)->iDataPage;
              pCell->nHash = ((lhcell *)pNew)->nHash;
              nSize = (((lhcell *)pNew)->sKey).nByte;
              if (nSize != 0) {
                SyBlobAppend(&pCell->sKey,(((lhcell *)pNew)->sKey).pBlob,nSize);
              }
              iVar3 = lhInstallCell(pCell);
              high_mask = local_38;
              if (iVar3 == 0) {
                lhCellWriteHeader(pCell);
                iVar2 = 0;
                high_mask = local_38;
              }
            }
          }
        }
        if (iVar2 != 0) goto LAB_0011500e;
        lhUnlinkCell((lhcell *)pNew);
      }
      pNew = (lhpage *)plVar1;
    } while (plVar1 != (lhcell *)0x0);
    iVar2 = 0;
LAB_0011500e:
    if (((local_48 & 6) == 0) && (uStack_50._4_4_ != 0)) {
      SyMemBackendFree(local_60,local_58);
    }
  }
  return iVar2;
}

Assistant:

static int lhPageSplit(
	lhpage *pOld,      /* Page to be split */
	lhpage *pNew,      /* New page */
	pgno split_bucket, /* Current split bucket */
	pgno high_mask     /* High mask (Max split bucket - 1) */
	)
{
	lhcell *pCell,*pNext;
	SyBlob sWorker;
	pgno iBucket;
	int rc; 
	SyBlobInit(&sWorker,&pOld->pHash->sAllocator);
	/* Perform the split */
	pCell = pOld->pList;
	for( ;; ){
		if( pCell == 0 ){
			/* No more cells */
			break;
		}
		/* Obtain the new logical bucket */
		iBucket = pCell->nHash & high_mask;
		pNext =  pCell->pNext;
		if( iBucket != split_bucket){
			rc = UNQLITE_OK;
			if( pCell->iOvfl ){
				/* Transfer the cell only */
				rc = lhTransferCell(pCell,pNew);
			}else{
				/* Transfer the cell and its payload */
				SyBlobReset(&sWorker);
				if( SyBlobLength(&pCell->sKey) < 1 ){
					/* Consume the key */
					rc = lhConsumeCellkey(pCell,unqliteDataConsumer,&pCell->sKey,0);
					if( rc != UNQLITE_OK ){
						goto fail;
					}
				}
				/* Consume the data (Very small data < 65k) */
				rc = lhConsumeCellData(pCell,unqliteDataConsumer,&sWorker);
				if( rc != UNQLITE_OK ){
					goto fail;
				}
				/* Perform the transfer */
				rc = lhStoreCell(
					pNew,
					SyBlobData(&pCell->sKey),(int)SyBlobLength(&pCell->sKey),
					SyBlobData(&sWorker),SyBlobLength(&sWorker),
					pCell->nHash,
					1
					);
			}
			if( rc != UNQLITE_OK ){
				goto fail;
			}
			/* Discard the cell from the old page */
			lhUnlinkCell(pCell);
		}
		/* Point to the next cell */
		pCell = pNext;
	}
	/* All done */
	rc = UNQLITE_OK;
fail:
	SyBlobRelease(&sWorker);
	return rc;
}